

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O1

void __thiscall libtorrent::aux::torrent::set_state(torrent *this,state_t s)

{
  int *piVar1;
  bool in;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  _List_node_base *p_Var3;
  bool bVar4;
  state_t local_3c;
  _Head_base<0UL,_libtorrent::aux::piece_picker_*,_false> local_30;
  state_t local_24;
  
  if (((state_t)((ulong)*(undefined8 *)&(this->super_torrent_hot_members).field_0x48 >> 0x39) &
      checking_resume_data) != s) {
    local_3c = s;
    iVar2 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
              [5])();
    if ((*(uint *)(CONCAT44(extraout_var,iVar2) + 0x68) & 0x40) != 0) {
      iVar2 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                _vptr_session_logger[5])();
      get_handle((torrent *)&stack0xffffffffffffffc8);
      local_24 = (state_t)((ulong)*(undefined8 *)&(this->super_torrent_hot_members).field_0x48 >>
                          0x39) & checking_resume_data;
      alert_manager::
      emplace_alert<libtorrent::state_changed_alert,libtorrent::torrent_handle,libtorrent::torrent_status::state_t_const&,libtorrent::torrent_status::state_t>
                ((alert_manager *)CONCAT44(extraout_var_00,iVar2),
                 (torrent_handle *)&stack0xffffffffffffffc8,&local_3c,&stack0xffffffffffffffdc);
      if (local_30._M_head_impl != (piece_picker *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          piVar1 = (int *)((long)&((local_30._M_head_impl)->m_piece_map).
                                  super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                                  .
                                  super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                                  ._M_impl.super__Vector_impl_data._M_finish + 4);
          iVar2 = *piVar1;
          *piVar1 = *piVar1 + -1;
          UNLOCK();
        }
        else {
          iVar2 = *(int *)((long)&((local_30._M_head_impl)->m_piece_map).
                                  super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                                  .
                                  super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                                  ._M_impl.super__Vector_impl_data._M_finish + 4);
          *(int *)((long)&((local_30._M_head_impl)->m_piece_map).
                          super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                          .
                          super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                          ._M_impl.super__Vector_impl_data._M_finish + 4) = iVar2 + -1;
        }
        if (iVar2 == 1) {
          (*(code *)((local_30._M_head_impl)->m_piece_map).
                    super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                    .
                    super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                    ._M_impl.super__Vector_impl_data._M_start[3])();
        }
      }
    }
    if (local_3c == finished) {
      iVar2 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                _vptr_session_logger[5])();
      if ((*(uint *)(CONCAT44(extraout_var_01,iVar2) + 0x68) & 0x40) != 0) {
        iVar2 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                  _vptr_session_logger[5])();
        get_handle((torrent *)&stack0xffffffffffffffc8);
        alert_manager::emplace_alert<libtorrent::torrent_finished_alert,libtorrent::torrent_handle>
                  ((alert_manager *)CONCAT44(extraout_var_02,iVar2),
                   (torrent_handle *)&stack0xffffffffffffffc8);
        if ((__uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
             )local_30._M_head_impl !=
            (__uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
             )0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            piVar1 = (int *)((long)local_30._M_head_impl + 0xc);
            iVar2 = *piVar1;
            *piVar1 = *piVar1 + -1;
            UNLOCK();
          }
          else {
            iVar2 = *(int *)((long)local_30._M_head_impl + 0xc);
            *(int *)((long)local_30._M_head_impl + 0xc) = iVar2 + -1;
          }
          if (iVar2 == 1) {
            (**(code **)(*(long *)local_30._M_head_impl + 0x18))();
          }
        }
      }
    }
    if (((this->field_0x5cc & 0x10) == 0) ||
       (((uint)((ulong)*(undefined8 *)&(this->super_torrent_hot_members).field_0x48 >> 0x39) & 6) -
        2 < 4)) {
      bVar4 = false;
    }
    else {
      bVar4 = local_3c - downloading_metadata < 4;
    }
    *(ulong *)&(this->super_torrent_hot_members).field_0x48 =
         *(ulong *)&(this->super_torrent_hot_members).field_0x48 & 0xf1ffffffffffffff |
         (ulong)(local_3c & checking_resume_data) << 0x39;
    update_gauge(this);
    update_want_peers(this);
    in = want_tick(this);
    update_list(this,(torrent_list_index_t)0x1,in);
    update_state_list(this);
    state_updated(this);
    (*(this->super_request_callback)._vptr_request_callback[7])
              (this,"set_state() %d",
               (ulong)((uint)((ulong)*(undefined8 *)&(this->super_torrent_hot_members).field_0x48 >>
                             0x39) & 7));
    if (bVar4) {
      (*(this->super_request_callback)._vptr_request_callback[7])(this);
      auto_managed(this,false);
      pause(this);
      this->field_0x5cc = this->field_0x5cc & 0xef;
    }
    for (p_Var3 = (this->m_extensions).
                  super__List_base<std::shared_ptr<libtorrent::torrent_plugin>,_std::allocator<std::shared_ptr<libtorrent::torrent_plugin>_>_>
                  ._M_impl._M_node.super__List_node_base._M_next;
        p_Var3 != (_List_node_base *)&this->m_extensions; p_Var3 = p_Var3->_M_next) {
      (**(code **)((long)(p_Var3[1]._M_next)->_M_next + 0x48))
                (p_Var3[1]._M_next,
                 (uint)((ulong)*(undefined8 *)&(this->super_torrent_hot_members).field_0x48 >> 0x39)
                 & 7);
    }
  }
  return;
}

Assistant:

void torrent::set_state(torrent_status::state_t const s)
	{
		TORRENT_ASSERT(is_single_thread());
		TORRENT_ASSERT(s != 0); // this state isn't used anymore

#if TORRENT_USE_ASSERTS

		if (s == torrent_status::seeding)
		{
			TORRENT_ASSERT(is_seed());
			TORRENT_ASSERT(is_finished());
		}
		if (s == torrent_status::finished)
			TORRENT_ASSERT(is_finished());
		if (s == torrent_status::downloading && m_state == torrent_status::finished)
			TORRENT_ASSERT(!is_finished());
#endif

		if (int(m_state) == s) return;

		if (m_ses.alerts().should_post<state_changed_alert>())
		{
			m_ses.alerts().emplace_alert<state_changed_alert>(get_handle()
				, s, static_cast<torrent_status::state_t>(m_state));
		}

		if (s == torrent_status::finished
			&& alerts().should_post<torrent_finished_alert>())
		{
			alerts().emplace_alert<torrent_finished_alert>(
				get_handle());
		}

		bool const trigger_stop = m_stop_when_ready
			&& !is_downloading_state(m_state)
			&& is_downloading_state(s);

		// we need to update the state before calling pause(), because otherwise
		// it may think we're still checking files, even though we're just
		// leaving that state
		m_state = s;

		update_gauge();
		update_want_peers();
		update_want_tick();
		update_state_list();

		state_updated();

#ifndef TORRENT_DISABLE_LOGGING
		debug_log("set_state() %d", m_state);
#endif

		if (trigger_stop)
		{
#ifndef TORRENT_DISABLE_LOGGING
			debug_log("stop_when_ready triggered");
#endif
			// stop_when_ready is set, and we're transitioning from a downloading
			// state to a non-downloading state. pause the torrent. Note that
			// "downloading" is defined broadly to include any state where we
			// either upload or download (for the purpose of this flag).
			auto_managed(false);
			pause();
			m_stop_when_ready = false;
		}

#ifndef TORRENT_DISABLE_EXTENSIONS
		for (auto& ext : m_extensions)
		{
			ext->on_state(state());
		}
#endif
	}